

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase237::run(TestCase237 *this)

{
  Reader brand;
  undefined1 auVar1 [40];
  Reader brand_00;
  Reader brand_01;
  Reader brand_02;
  Schema *pSVar2;
  Schema *pSVar3;
  size_t sVar4;
  Schema SVar5;
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition;
  Array<capnp::Schema> list;
  Fault f;
  SchemaLoader loader;
  DebugComparison<capnp::Schema_&,_capnp::Schema> local_160;
  Array<capnp::Schema> local_138;
  Fault local_120;
  uint local_114;
  SchemaLoader local_110;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  RawBrandedSchema *local_28;
  
  SchemaLoader::SchemaLoader(&local_110);
  SchemaLoader::loadNative(&local_110,(RawSchema *)schemas::s_a0a8f314b80b63fd);
  SchemaLoader::getAllLoaded(&local_138,&local_110);
  pSVar2 = local_138.ptr;
  local_160.left = (Schema *)CONCAT44(local_160.left._4_4_,2);
  local_160.right.raw = (RawBrandedSchema *)local_138.size_;
  local_160.op.content.ptr = " == ";
  local_160.op.content.size_ = 5;
  local_160.result = (RawBrandedSchema *)local_138.size_ == (RawBrandedSchema *)0x2;
  if (local_160.result) {
    local_38 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    uStack_40 = 0;
    uStack_30 = 0x7fffffff;
    auVar1 = ZEXT1640(ZEXT816(0));
    brand._reader._40_8_ = 0x7fffffff;
    brand._reader.segment = (SegmentReader *)auVar1._0_8_;
    brand._reader.capTable = (CapTableReader *)auVar1._8_8_;
    brand._reader.data = (void *)auVar1._16_8_;
    brand._reader.pointers = (WirePointer *)auVar1._24_8_;
    brand._reader.dataSize = auVar1._32_4_;
    brand._reader.pointerCount = auVar1._36_2_;
    brand._reader._38_2_ = auVar1._38_2_;
    SVar5 = SchemaLoader::get(&local_110,0xa0a8f314b80b63fd,brand,(Schema)0x6ff7f8);
    pSVar3 = local_138.ptr;
    if (pSVar2->raw == SVar5.raw) {
      local_68 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_78 = 0;
      uStack_70 = 0;
      uStack_60 = 0x7fffffff;
      auVar1 = ZEXT1640(ZEXT816(0));
      brand_02._reader._40_8_ = 0x7fffffff;
      brand_02._reader.segment = (SegmentReader *)auVar1._0_8_;
      brand_02._reader.capTable = (CapTableReader *)auVar1._8_8_;
      brand_02._reader.data = (void *)auVar1._16_8_;
      brand_02._reader.pointers = (WirePointer *)auVar1._24_8_;
      brand_02._reader.dataSize = auVar1._32_4_;
      brand_02._reader.pointerCount = auVar1._36_2_;
      brand_02._reader._38_2_ = auVar1._38_2_;
      local_160.right = SchemaLoader::get(&local_110,0x9c8e9318b29d9cd3,brand_02,(Schema)0x6ff7f8);
      local_160.result = pSVar3[1].raw == local_160.right.raw;
      local_160.left = pSVar3 + 1;
      local_160.op.content.ptr = " == ";
      local_160.op.content.size_ = 5;
      if ((!local_160.result) && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::log<char_const(&)[59],kj::_::DebugComparison<capnp::Schema&,capnp::Schema>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                   ,0xf4,ERROR,
                   "\"failed: expected \" \"list[1] == loader.get(typeId<TestEnum>())\", _kjCondition"
                   ,(char (*) [59])"failed: expected list[1] == loader.get(typeId<TestEnum>())",
                   &local_160);
      }
    }
    else {
      local_98 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      uStack_90 = 0x7fffffff;
      auVar1 = ZEXT1640(ZEXT816(0));
      brand_00._reader._40_8_ = 0x7fffffff;
      brand_00._reader.segment = (SegmentReader *)auVar1._0_8_;
      brand_00._reader.capTable = (CapTableReader *)auVar1._8_8_;
      brand_00._reader.data = (void *)auVar1._16_8_;
      brand_00._reader.pointers = (WirePointer *)auVar1._24_8_;
      brand_00._reader.dataSize = auVar1._32_4_;
      brand_00._reader.pointerCount = auVar1._36_2_;
      brand_00._reader._38_2_ = auVar1._38_2_;
      local_160.right = SchemaLoader::get(&local_110,0x9c8e9318b29d9cd3,brand_00,(Schema)0x6ff7f8);
      local_160.result = pSVar3->raw == local_160.right.raw;
      local_160.left = pSVar3;
      local_160.op.content.ptr = " == ";
      local_160.op.content.size_ = 5;
      if ((!local_160.result) && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::log<char_const(&)[59],kj::_::DebugComparison<capnp::Schema&,capnp::Schema>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                   ,0xf6,ERROR,
                   "\"failed: expected \" \"list[0] == loader.get(typeId<TestEnum>())\", _kjCondition"
                   ,(char (*) [59])"failed: expected list[0] == loader.get(typeId<TestEnum>())",
                   &local_160);
      }
      pSVar2 = local_138.ptr;
      local_c8 = 0;
      local_e8 = 0;
      uStack_e0 = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      uStack_c0 = 0x7fffffff;
      auVar1 = ZEXT1640(ZEXT816(0));
      brand_01._reader._40_8_ = 0x7fffffff;
      brand_01._reader.segment = (SegmentReader *)auVar1._0_8_;
      brand_01._reader.capTable = (CapTableReader *)auVar1._8_8_;
      brand_01._reader.data = (void *)auVar1._16_8_;
      brand_01._reader.pointers = (WirePointer *)auVar1._24_8_;
      brand_01._reader.dataSize = auVar1._32_4_;
      brand_01._reader.pointerCount = auVar1._36_2_;
      brand_01._reader._38_2_ = auVar1._38_2_;
      local_160.right = SchemaLoader::get(&local_110,0xa0a8f314b80b63fd,brand_01,(Schema)0x6ff7f8);
      local_160.result = pSVar2[1].raw == local_160.right.raw;
      local_160.left = pSVar2 + 1;
      local_160.op.content.ptr = " == ";
      local_160.op.content.size_ = 5;
      if ((!local_160.result) && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::log<char_const(&)[63],kj::_::DebugComparison<capnp::Schema&,capnp::Schema>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                   ,0xf7,ERROR,
                   "\"failed: expected \" \"list[1] == loader.get(typeId<TestAllTypes>())\", _kjCondition"
                   ,(char (*) [63])"failed: expected list[1] == loader.get(typeId<TestAllTypes>())",
                   &local_160);
      }
    }
    sVar4 = local_138.size_;
    pSVar2 = local_138.ptr;
    if (local_138.ptr != (Schema *)0x0) {
      local_138.ptr = (Schema *)0x0;
      local_138.size_ = 0;
      (**(local_138.disposer)->_vptr_ArrayDisposer)(local_138.disposer,pSVar2,8,sVar4,sVar4,0);
    }
    SchemaLoader::~SchemaLoader(&local_110);
    return;
  }
  local_114 = 2;
  local_28 = (RawBrandedSchema *)local_138.size_;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
            (&local_120,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
             ,0xf2,FAILED,"(2u) == (list.size())","_kjCondition,2u, list.size()",
             (DebugComparison<unsigned_int,_unsigned_long> *)&local_160,&local_114,
             (unsigned_long *)&local_28);
  kj::_::Debug::Fault::fatal(&local_120);
}

Assistant:

TEST(SchemaLoader, Enumerate) {
  SchemaLoader loader;
  loader.loadCompiledTypeAndDependencies<TestAllTypes>();
  auto list = loader.getAllLoaded();

  ASSERT_EQ(2u, list.size());
  if (list[0] == loader.get(typeId<TestAllTypes>())) {
    EXPECT_TRUE(list[1] == loader.get(typeId<TestEnum>()));
  } else {
    EXPECT_TRUE(list[0] == loader.get(typeId<TestEnum>()));
    EXPECT_TRUE(list[1] == loader.get(typeId<TestAllTypes>()));
  }
}